

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86ATTInstPrinter.c
# Opt level: O2

void printOperand(MCInst *MI,uint OpNo,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  uint8_t uVar3;
  _Bool _Var4;
  byte bVar5;
  uint uVar6;
  MCOperand *op;
  ulong uVar7;
  ulong uVar8;
  char *fmt;
  uint8_t uVar9;
  
  op = MCInst_getOperand(MI,OpNo);
  _Var4 = MCOperand_isReg(op);
  if (_Var4) {
    uVar6 = MCOperand_getReg(op);
    printRegName(O,uVar6);
    if (MI->csh->detail != CS_OPT_OFF) {
      pcVar2 = MI->flat_insn->detail;
      uVar7 = (ulong)(pcVar2->field_6).x86.op_count;
      if (MI->csh->doing_mem == true) {
        *(uint *)(pcVar2->groups + uVar7 * 0x30 + 0x4a) = uVar6;
      }
      else {
        puVar1 = pcVar2->groups + uVar7 * 0x30 + 0x3e;
        puVar1[0] = '\x01';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        pcVar2 = MI->flat_insn->detail;
        *(uint *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.op_count * 0x30 + 0x46) = uVar6;
        pcVar2 = MI->flat_insn->detail;
        pcVar2->groups[(ulong)(pcVar2->field_6).x86.op_count * 0x30 + 0x5e] =
             MI->csh->regsize_map[uVar6];
        puVar1 = &(MI->flat_insn->detail->field_6).x86.op_count;
        *puVar1 = *puVar1 + '\x01';
      }
    }
    if (MI->op1_size != '\0') {
      return;
    }
    MI->op1_size = MI->csh->regsize_map[uVar6];
    return;
  }
  _Var4 = MCOperand_isImm(op);
  if (!_Var4) {
    return;
  }
  uVar7 = MCOperand_getImm(op);
  uVar6 = MCInst_getOpcode(MI);
  if (((((((uVar6 - 0x3b < 0x34) && ((0xd80000000000bU >> ((ulong)(uVar6 - 0x3b) & 0x3f) & 1) != 0))
         || ((uVar6 - 0x9ae < 0x40 &&
             ((0xb000000012000009U >> ((ulong)(uVar6 - 0x9ae) & 0x3f) & 1) != 0)))) ||
        ((uVar6 - 0xb54 < 6 ||
         ((uVar6 - 0x212 < 0x11 && ((0x16201U >> (uVar6 - 0x212 & 0x1f) & 1) != 0)))))) ||
       (((uVar6 - 0x4df < 0x36 && ((0x20040040000801U >> ((ulong)(uVar6 - 0x4df) & 0x3f) & 1) != 0))
        || ((uVar6 - 0x75a < 0x11 && ((0x1001bU >> (uVar6 - 0x75a & 0x1f) & 1) != 0)))))) ||
      ((uVar6 - 0xc6 < 5 && (uVar6 - 0xc6 != 2)))) ||
     ((((uVar6 - 0x905 < 0x24 && ((0x900000009U >> ((ulong)(uVar6 - 0x905) & 0x3f) & 1) != 0)) ||
       ((uVar6 - 0x966 < 0x1c && ((0x9000009U >> (uVar6 - 0x966 & 0x1f) & 1) != 0)))) ||
      ((((uVar6 - 0xa49 < 0x2c && ((0x90000000009U >> ((ulong)(uVar6 - 0xa49) & 0x3f) & 1) != 0)) ||
        ((uVar6 - 0xaed < 5 && (uVar6 - 0xaed != 2)))) ||
       ((((uVar6 - 0x1863 < 5 && (uVar6 - 0x1863 != 2)) ||
         ((uVar6 - 0x662 < 7 && ((0x61U >> (uVar6 - 0x662 & 0x1f) & 1) != 0)))) ||
        ((uVar6 - 0x15 < 2 || (uVar6 == 0x8d6)))))))))) {
    uVar7 = uVar7 & 0xff;
    uVar9 = '\x01';
  }
  else {
    uVar9 = '\0';
  }
  uVar6 = MI->flat_insn->id;
  if (uVar6 - 0x9c < 2) {
    uVar3 = '\x02';
    if (OpNo != 1) {
      uVar3 = uVar9;
    }
    uVar9 = uVar3;
    if (OpNo == 1) {
      uVar7 = uVar7 & 0xffff;
    }
    uVar8 = uVar7;
    if ((long)uVar7 < 10) {
LAB_001a127f:
      fmt = "%lu";
      uVar7 = uVar8;
      goto LAB_001a1299;
    }
LAB_001a1258:
    fmt = "0x%lx";
    uVar8 = uVar7;
  }
  else {
    uVar8 = uVar7;
    if (uVar6 == 0x19) {
LAB_001a1218:
      if (9 < uVar7) {
        bVar5 = MI->op1_size;
        if (bVar5 == 0) {
          bVar5 = MI->imm_size;
        }
        uVar7 = uVar7 & arch_masks[bVar5];
        goto LAB_001a1258;
      }
    }
    else {
      if (uVar6 != 0x95) {
        if ((uVar6 != 0x145) && (uVar6 != 0x147)) {
          if ((long)uVar7 < 0) {
            uVar8 = -uVar7;
            if (uVar7 < 0xfffffffffffffff7) {
              fmt = "-0x%lx";
            }
            else {
              fmt = "-%lu";
            }
            goto LAB_001a1299;
          }
          if (uVar7 < 10) goto LAB_001a127f;
          goto LAB_001a1258;
        }
        goto LAB_001a1218;
      }
      if (9 < uVar7) {
        uVar8 = uVar7 & 0xffff;
        fmt = "0x%x";
        uVar7 = uVar8;
        goto LAB_001a1299;
      }
    }
    fmt = "%u";
  }
LAB_001a1299:
  SStream_concat(O,fmt,uVar8);
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar2 = MI->flat_insn->detail;
    uVar8 = (ulong)(pcVar2->field_6).x86.op_count;
    if (MI->csh->doing_mem == true) {
      *(ulong *)(pcVar2->groups + uVar8 * 0x30 + 0x56) = uVar7;
    }
    else {
      puVar1 = pcVar2->groups + uVar8 * 0x30 + 0x3e;
      puVar1[0] = '\x02';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      pcVar2 = MI->flat_insn->detail;
      if (uVar9 == '\0') {
        uVar8 = (ulong)(pcVar2->field_6).x86.op_count;
        if (uVar8 == 0) {
          *(uint8_t *)((long)&pcVar2->field_6 + 0x50) = MI->imm_size;
        }
        else {
          if ((MI->flat_insn->id & 0xfffffffe) == 0x9c) {
            uVar9 = MI->imm_size;
          }
          else {
            uVar9 = *(uint8_t *)((long)&pcVar2->field_6 + 0x50);
          }
          pcVar2->groups[uVar8 * 0x30 + 0x5e] = uVar9;
        }
      }
      else {
        pcVar2->groups[(ulong)(pcVar2->field_6).x86.op_count * 0x30 + 0x5e] = uVar9;
      }
      pcVar2 = MI->flat_insn->detail;
      *(ulong *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.op_count * 0x30 + 0x46) = uVar7;
      puVar1 = &(MI->flat_insn->detail->field_6).x86.op_count;
      *puVar1 = *puVar1 + '\x01';
    }
  }
  return;
}

Assistant:

static void printOperand(MCInst *MI, unsigned OpNo, SStream *O)
{
	uint8_t opsize = 0;
	MCOperand *Op  = MCInst_getOperand(MI, OpNo);

	if (MCOperand_isReg(Op)) {
		unsigned int reg = MCOperand_getReg(Op);
		printRegName(O, reg);
		if (MI->csh->detail) {
			if (MI->csh->doing_mem) {
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.base = reg;
			} else {
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].type = X86_OP_REG;
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].reg = reg;
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size = MI->csh->regsize_map[reg];
				MI->flat_insn->detail->x86.op_count++;
			}
		}
	} else if (MCOperand_isImm(Op)) {
		// Print X86 immediates as signed values.
		int64_t imm = MCOperand_getImm(Op);

		switch(MCInst_getOpcode(MI)) {
			default:
				break;

			case X86_AAD8i8:
			case X86_AAM8i8:
			case X86_ADC8i8:
			case X86_ADD8i8:
			case X86_AND8i8:
			case X86_CMP8i8:
			case X86_OR8i8:
			case X86_SBB8i8:
			case X86_SUB8i8:
			case X86_TEST8i8:
			case X86_XOR8i8:
			case X86_ROL8ri:
			case X86_ADC8ri:
			case X86_ADD8ri:
			case X86_ADD8ri8:
			case X86_AND8ri:
			case X86_AND8ri8:
			case X86_CMP8ri:
			case X86_MOV8ri:
			case X86_MOV8ri_alt:
			case X86_OR8ri:
			case X86_OR8ri8:
			case X86_RCL8ri:
			case X86_RCR8ri:
			case X86_ROR8ri:
			case X86_SAL8ri:
			case X86_SAR8ri:
			case X86_SBB8ri:
			case X86_SHL8ri:
			case X86_SHR8ri:
			case X86_SUB8ri:
			case X86_SUB8ri8:
			case X86_TEST8ri:
			case X86_TEST8ri_NOREX:
			case X86_TEST8ri_alt:
			case X86_XOR8ri:
			case X86_XOR8ri8:
			case X86_OUT8ir:

			case X86_ADC8mi:
			case X86_ADD8mi:
			case X86_AND8mi:
			case X86_CMP8mi:
			case X86_LOCK_ADD8mi:
			case X86_LOCK_AND8mi:
			case X86_LOCK_OR8mi:
			case X86_LOCK_SUB8mi:
			case X86_LOCK_XOR8mi:
			case X86_MOV8mi:
			case X86_OR8mi:
			case X86_RCL8mi:
			case X86_RCR8mi:
			case X86_ROL8mi:
			case X86_ROR8mi:
			case X86_SAL8mi:
			case X86_SAR8mi:
			case X86_SBB8mi:
			case X86_SHL8mi:
			case X86_SHR8mi:
			case X86_SUB8mi:
			case X86_TEST8mi:
			case X86_TEST8mi_alt:
			case X86_XOR8mi:
			case X86_PUSH64i8:
			case X86_CMP32ri8:
			case X86_CMP64ri8:

				imm = imm & 0xff;
				opsize = 1;     // immediate of 1 byte
				break;
		}

		switch(MI->flat_insn->id) {
			default:
				if (imm >= 0) {
					if (imm > HEX_THRESHOLD)
						SStream_concat(O, "$0x%"PRIx64, imm);
					else
						SStream_concat(O, "$%"PRIu64, imm);
				} else {
					if (imm < -HEX_THRESHOLD)
						SStream_concat(O, "$-0x%"PRIx64, -imm);
					else
						SStream_concat(O, "$-%"PRIu64, -imm);
				}
				break;

			case X86_INS_INT:
				// do not print number in negative form
				imm = imm & 0xff;
				if (imm >= 0 && imm <= HEX_THRESHOLD)
					SStream_concat(O, "$%u", imm);
				else {
					SStream_concat(O, "$0x%x", imm);
				}
				break;

			case X86_INS_LCALL:
			case X86_INS_LJMP:
				// always print address in positive form
				if (OpNo == 1) { // selector is ptr16
					imm = imm & 0xffff;
					opsize = 2;
				}
				SStream_concat(O, "$0x%"PRIx64, imm);
				break;

			case X86_INS_AND:
			case X86_INS_OR:
			case X86_INS_XOR:
				// do not print number in negative form
				if (imm >= 0 && imm <= HEX_THRESHOLD)
					SStream_concat(O, "$%u", imm);
				else {
					imm = arch_masks[MI->op1_size? MI->op1_size : MI->imm_size] & imm;
					SStream_concat(O, "$0x%"PRIx64, imm);
				}
				break;

			case X86_INS_RET:
				// RET imm16
				if (imm >= 0 && imm <= HEX_THRESHOLD)
					SStream_concat(O, "$%u", imm);
				else {
					imm = 0xffff & imm;
					SStream_concat(O, "$0x%x", imm);
				}
				break;
		}

		if (MI->csh->detail) {
			if (MI->csh->doing_mem) {
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].type = X86_OP_MEM;
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.disp = imm;
			} else {
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].type = X86_OP_IMM;
				MI->has_imm = true;
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].imm = imm;

				if (opsize > 0)
					MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size = opsize;
				else if (MI->op1_size > 0)
					MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size = MI->op1_size;
				else
					MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size = MI->imm_size;

				MI->flat_insn->detail->x86.op_count++;
			}
		}
	}
}